

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

string * __thiscall
BusyIndicator::writeXml_abi_cxx11_(string *__return_storage_ptr__,BusyIndicator *this,int indent)

{
  ostream *poVar1;
  int level;
  stringstream str;
  string sStack_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  Util::getIndent_abi_cxx11_(&sStack_208,(Util *)(ulong)(uint)indent,level);
  poVar1 = std::operator<<(local_198,(string *)&sStack_208);
  std::operator<<(poVar1,"<BusyIndicator");
  std::__cxx11::string::~string((string *)&sStack_208);
  std::__cxx11::string::string((string *)&local_1e8,"animating",(allocator *)&sStack_208);
  Util::writeXmlAttribute<bool>(&local_1c8,(stringstream *)local_1a8,&local_1e8,this->animating);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1a8);
  poVar1 = std::operator<<(local_198," />");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string BusyIndicator::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<BusyIndicator";

	Util::writeXmlAttribute(str, "animating", animating);
	writeXmlAttributes(str);
	str << " />" << std::endl;
	return str.str();
}